

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  curl_slist *pcVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  Curl_addrinfo *pCVar8;
  Curl_addrinfo *pCVar9;
  void *pvVar10;
  Curl_dns_entry *pCVar11;
  Curl_addrinfo *in_RCX;
  undefined7 uVar12;
  Curl_addrinfo *pCVar13;
  Curl_addrinfo *pCVar14;
  uint uVar15;
  char *__s;
  int port;
  char hostname [256];
  char address [64];
  char entry_id [262];
  undefined1 local_2b0 [16];
  Curl_addrinfo *local_2a0;
  CURLcode local_294;
  Curl_addrinfo *local_290;
  Curl_addrinfo *local_288;
  Curl_addrinfo *local_280;
  char local_278 [256];
  char local_178 [64];
  char local_138 [264];
  
  local_2b0._0_4_ = 0;
  puVar1 = &(data->state).field_0x6d2;
  *puVar1 = *puVar1 & 0xf7;
  pcVar2 = (data->state).resolve;
  local_2b0._8_8_ = data;
  do {
    if (pcVar2 == (curl_slist *)0x0) {
      (data->state).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar6 = pcVar2->data;
    if (pcVar6 == (char *)0x0) {
      uVar15 = 0;
    }
    else if (*pcVar6 == '-') {
      in_RCX = (Curl_addrinfo *)local_2b0;
      iVar4 = __isoc99_sscanf(pcVar6 + 1,"%255[^:]:%d",local_278);
      if (iVar4 == 2) {
        create_hostcache_id(local_278,local_2b0._0_4_,local_138,(size_t)in_RCX);
        sVar5 = strlen(local_138);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        Curl_hash_delete((data->dns).hostcache,local_138,sVar5 + 1);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
        }
      }
      else {
        Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'",pcVar2->data);
      }
      uVar15 = 0;
      if (iVar4 == 2) {
LAB_0013731f:
        uVar15 = 0;
      }
    }
    else {
      local_2b0[7] = *pcVar2->data;
      uVar12 = (undefined7)((ulong)in_RCX >> 8);
      __s = pcVar2->data + (local_2b0[7] == '+');
      pcVar6 = strchr(__s,0x3a);
      in_RCX = (Curl_addrinfo *)CONCAT71(uVar12,1);
      if ((pcVar6 == (char *)0x0) || (sVar5 = (long)pcVar6 - (long)__s, 0xff < (long)sVar5)) {
        pCVar9 = (Curl_addrinfo *)0x0;
        pCVar14 = (Curl_addrinfo *)0x0;
      }
      else {
        memcpy(local_278,__s,sVar5);
        local_278[sVar5] = '\0';
        uVar7 = strtoul(pcVar6 + 1,(char **)&local_2a0,10);
        if (((uVar7 < 0x10000) && (in_RCX = local_2a0, local_2a0 != (Curl_addrinfo *)(pcVar6 + 1)))
           && ((char)local_2a0->ai_flags == ':')) {
          in_RCX = (Curl_addrinfo *)((long)&local_2a0->ai_flags + 1);
          local_2b0._0_4_ = (uint)uVar7;
          local_288 = in_RCX;
          if ((char)local_2a0->ai_flags == '\0') {
            local_290 = (Curl_addrinfo *)0x0;
            pCVar8 = local_2a0;
          }
          else {
            local_290 = (Curl_addrinfo *)0x0;
            local_280 = (Curl_addrinfo *)0x0;
            pCVar9 = local_2a0;
            do {
              pCVar14 = (Curl_addrinfo *)((long)&pCVar9->ai_flags + 1);
              pCVar8 = (Curl_addrinfo *)strchr((char *)pCVar14,0x2c);
              if (pCVar8 == (Curl_addrinfo *)0x0) {
                sVar5 = strlen((char *)pCVar14);
                pCVar8 = (Curl_addrinfo *)((long)&pCVar14->ai_flags + sVar5);
              }
              uVar12 = (undefined7)((ulong)in_RCX >> 8);
              pCVar13 = pCVar8;
              if ((char)pCVar14->ai_flags == '[') {
                uVar15 = 5;
                in_RCX = (Curl_addrinfo *)CONCAT71(uVar12,1);
                if ((pCVar8 != pCVar14) && (*(char *)((long)&pCVar8[-1].ai_next + 7) == ']')) {
                  pCVar14 = (Curl_addrinfo *)((long)&pCVar9->ai_flags + 2);
                  pCVar13 = (Curl_addrinfo *)((long)&pCVar8[-1].ai_next + 7);
                  goto LAB_00137419;
                }
              }
              else {
LAB_00137419:
                in_RCX = (Curl_addrinfo *)CONCAT71(uVar12,1);
                uVar7 = (long)pCVar13 - (long)pCVar14;
                if (uVar7 == 0) {
                  uVar15 = 6;
                }
                else {
                  uVar15 = 5;
                  if (uVar7 < 0x40) {
                    memcpy(local_178,pCVar14,uVar7);
                    local_178[uVar7] = '\0';
                    pCVar9 = Curl_str2addr(local_178,local_2b0._0_4_);
                    if (pCVar9 == (Curl_addrinfo *)0x0) {
                      Curl_infof((Curl_easy *)local_2b0._8_8_,"Resolve address \'%s\' found illegal"
                                 ,local_178);
                      pCVar14 = local_290;
                      pCVar9 = local_280;
                    }
                    else {
                      uVar15 = 0;
                      in_RCX = local_280;
                      pCVar14 = pCVar9;
                      if (local_280 != (Curl_addrinfo *)0x0) {
                        local_280->ai_next = pCVar9;
                        pCVar14 = local_290;
                      }
                    }
                    local_280 = pCVar9;
                    local_290 = pCVar14;
                    in_RCX = (Curl_addrinfo *)CONCAT71((int7)((ulong)in_RCX >> 8),1);
                  }
                }
              }
              if ((uVar15 != 0) && (uVar15 != 6)) {
                pCVar9 = local_288;
                pCVar14 = local_290;
                data = (Curl_easy *)local_2b0._8_8_;
                local_2a0 = pCVar8;
                if (uVar15 != 5) goto LAB_00137686;
                goto LAB_001374da;
              }
              pCVar9 = pCVar8;
            } while ((char)pCVar8->ai_flags != '\0');
          }
          in_RCX = (Curl_addrinfo *)
                   CONCAT71((int7)((ulong)in_RCX >> 8),local_290 == (Curl_addrinfo *)0x0);
          pCVar9 = local_288;
          pCVar14 = local_290;
          local_2a0 = pCVar8;
        }
        else {
          in_RCX = (Curl_addrinfo *)CONCAT71((int7)((ulong)in_RCX >> 8),1);
          pCVar9 = (Curl_addrinfo *)0x0;
          pCVar14 = (Curl_addrinfo *)0x0;
        }
      }
LAB_001374da:
      data = (Curl_easy *)local_2b0._8_8_;
      if ((char)in_RCX == '\0') {
        local_288 = pCVar9;
        create_hostcache_id(local_278,local_2b0._0_4_,local_138,(size_t)in_RCX);
        sVar5 = strlen(local_138);
        if (*(Curl_share **)((long)data + 200) != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        pvVar10 = Curl_hash_pick(((Names *)((long)data + 0xa8))->hostcache,local_138,sVar5 + 1);
        if (pvVar10 != (void *)0x0) {
          Curl_infof(data,"RESOLVE %s:%d is - old addresses discarded",local_278,
                     (ulong)(uint)local_2b0._0_4_);
          Curl_hash_delete(((Names *)((long)data + 0xa8))->hostcache,local_138,sVar5 + 1);
        }
        in_RCX = (Curl_addrinfo *)(ulong)(uint)local_2b0._0_4_;
        pCVar11 = Curl_cache_addr(data,pCVar14,local_278,local_2b0._0_4_);
        cVar3 = local_2b0[7];
        if (pCVar11 != (Curl_dns_entry *)0x0) {
          if (local_2b0[7] != '+') {
            pCVar11->timestamp = 0;
          }
          pCVar11->inuse = pCVar11->inuse + -1;
        }
        if (*(Curl_share **)((long)data + 200) != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
        }
        if (pCVar11 == (Curl_dns_entry *)0x0) {
          Curl_freeaddrinfo(pCVar14);
          local_294 = CURLE_OUT_OF_MEMORY;
          uVar15 = 1;
        }
        else {
          in_RCX = (Curl_addrinfo *)(ulong)(uint)local_2b0._0_4_;
          pcVar6 = "";
          if (cVar3 == '+') {
            pcVar6 = " (non-permanent)";
          }
          uVar15 = 0;
          Curl_infof(data,"Added %s:%d:%s to DNS cache%s",local_278,in_RCX,local_288,pcVar6);
          if ((local_278[0] == '*') && (local_278[1] == '\0')) {
            in_RCX = (Curl_addrinfo *)(ulong)(uint)local_2b0._0_4_;
            uVar15 = 0;
            Curl_infof(data,"RESOLVE %s:%d is wildcard, enabling wildcard checks",local_278,in_RCX);
            puVar1 = &((UrlState *)((long)data + 0xc30))->field_0x6d2;
            *puVar1 = *puVar1 | 8;
          }
        }
      }
      else {
        Curl_failf((Curl_easy *)local_2b0._8_8_,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",
                   pcVar2->data);
        Curl_freeaddrinfo(pCVar14);
        local_294 = CURLE_SETOPT_OPTION_SYNTAX;
        uVar15 = 1;
      }
LAB_00137686:
      if (uVar15 == 0) goto LAB_0013731f;
    }
    if ((uVar15 & 3) != 0) {
      return local_294;
    }
    pcVar2 = pcVar2->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  int port = 0;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = false;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      char *end_ptr;
      bool permanent = TRUE;
      char *host_begin;
      char *host_end;
      unsigned long tmp_port;
      bool error = true;

      host_begin = hostp->data;
      if(host_begin[0] == '+') {
        host_begin++;
        permanent = FALSE;
      }
      host_end = strchr(host_begin, ':');
      if(!host_end ||
         ((host_end - host_begin) >= (ptrdiff_t)sizeof(hostname)))
        goto err;

      memcpy(hostname, host_begin, host_end - host_begin);
      hostname[host_end - host_begin] = '\0';

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        struct Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
   err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if it's already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %s:%d is - old addresses discarded",
              hostname, port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, hostname, port);
      if(dns) {
        if(permanent)
          dns->timestamp = 0; /* mark as permanent */
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->inuse--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache%s",
            hostname, port, addresses, permanent ? "" : " (non-permanent)");

      /* Wildcard hostname */
      if(hostname[0] == '*' && hostname[1] == '\0') {
        infof(data, "RESOLVE %s:%d is wildcard, enabling wildcard checks",
              hostname, port);
        data->state.wildcard_resolve = true;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}